

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

void ncnn::yuv420sp2rgb(uchar *yuv420sp,int w,int h,uchar *rgb)

{
  byte bVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uchar *puVar11;
  uchar *puVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  
  if (0 < h) {
    puVar2 = yuv420sp + h * w;
    lVar8 = (long)(w * 3);
    puVar11 = yuv420sp + (long)w + 1;
    puVar3 = rgb + 5;
    iVar7 = 0;
    do {
      if (0 < w) {
        lVar15 = 0;
        puVar12 = puVar3;
        iVar5 = w + 2;
        do {
          iVar10 = (puVar2[lVar15] - 0x80) * 0x5a;
          iVar4 = (uint)yuv420sp[lVar15] * 0x40;
          iVar14 = iVar4 + iVar10 >> 6;
          iVar13 = 0;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          bVar1 = puVar2[lVar15 + 1];
          iVar9 = (bVar1 - 0x80) * -0x16 + (puVar2[lVar15] - 0x80) * -0x2e;
          puVar12[-5] = (uchar)iVar14;
          iVar14 = iVar9 + iVar4;
          if (iVar14 >> 6 < 1) {
            iVar14 = 0;
          }
          iVar14 = iVar14 >> 6;
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          iVar6 = (bVar1 - 0x80) * 0x71;
          puVar12[-4] = (uchar)iVar14;
          iVar4 = iVar4 + iVar6 >> 6;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[-3] = (uchar)iVar4;
          iVar14 = (uint)yuv420sp[lVar15 + 1] * 0x40;
          iVar4 = iVar14 + iVar10 >> 6;
          if (iVar4 < 1) {
            iVar4 = iVar13;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[-2] = (uchar)iVar4;
          iVar4 = iVar14 + iVar9;
          if (iVar4 >> 6 < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> 6;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[-1] = (uchar)iVar4;
          iVar4 = iVar14 + iVar6 >> 6;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          *puVar12 = (uchar)iVar4;
          iVar14 = (uint)puVar11[lVar15 + -1] * 0x40;
          iVar4 = iVar14 + iVar10 >> 6;
          if (iVar4 < 1) {
            iVar4 = iVar13;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[lVar8 + -5] = (uchar)iVar4;
          iVar4 = iVar14 + iVar9;
          if (iVar4 >> 6 < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> 6;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[lVar8 + -4] = (uchar)iVar4;
          iVar4 = iVar14 + iVar6 >> 6;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[lVar8 + -3] = (uchar)iVar4;
          iVar14 = (uint)puVar11[lVar15] * 0x40;
          iVar4 = iVar10 + iVar14 >> 6;
          if (iVar4 < 1) {
            iVar4 = iVar13;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          puVar12[lVar8 + -2] = (uchar)iVar4;
          iVar9 = iVar9 + iVar14;
          if (iVar9 >> 6 < 1) {
            iVar9 = 0;
          }
          iVar9 = iVar9 >> 6;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          puVar12[lVar8 + -1] = (uchar)iVar9;
          iVar4 = iVar14 + iVar6 >> 6;
          if (0 < iVar4) {
            iVar13 = iVar4;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          puVar12[lVar8] = (uchar)iVar13;
          lVar15 = lVar15 + 2;
          puVar12 = puVar12 + 6;
          iVar5 = iVar5 + -2;
        } while (2 < iVar5);
        puVar2 = puVar2 + lVar15;
      }
      yuv420sp = yuv420sp + w * 2;
      iVar7 = iVar7 + 2;
      puVar11 = puVar11 + w * 2;
      puVar3 = puVar3 + w * 6;
    } while (iVar7 < h);
  }
  return;
}

Assistant:

void yuv420sp2rgb(const unsigned char* yuv420sp, int w, int h, unsigned char* rgb)
{
    const unsigned char* yptr = yuv420sp;
    const unsigned char* vuptr = yuv420sp + w * h;

#if __ARM_NEON
    uint8x8_t _v128 = vdup_n_u8(128);
    int8x8_t _v90 = vdup_n_s8(90);
    int8x8_t _v46 = vdup_n_s8(46);
    int8x8_t _v22 = vdup_n_s8(22);
    int8x8_t _v113 = vdup_n_s8(113);
#endif // __ARM_NEON

    for (int y=0; y<h; y+=2)
    {
        const unsigned char* yptr0 = yptr;
        const unsigned char* yptr1 = yptr + w;
        unsigned char* rgb0 = rgb;
        unsigned char* rgb1 = rgb + w*3;

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn>0; nn--)
        {
            int16x8_t _yy0 = vreinterpretq_s16_u16(vshll_n_u8(vld1_u8(yptr0), 6));
            int16x8_t _yy1 = vreinterpretq_s16_u16(vshll_n_u8(vld1_u8(yptr1), 6));

            int8x8_t _vvuu = vreinterpret_s8_u8(vsub_u8(vld1_u8(vuptr), _v128));
            int8x8x2_t _vvvvuuuu = vtrn_s8(_vvuu, _vvuu);
            int8x8_t _vv = _vvvvuuuu.val[0];
            int8x8_t _uu = _vvvvuuuu.val[1];

            int16x8_t _r0 = vmlal_s8(_yy0, _vv, _v90);
            int16x8_t _g0 = vmlsl_s8(_yy0, _vv, _v46);
            _g0 = vmlsl_s8(_g0, _uu, _v22);
            int16x8_t _b0 = vmlal_s8(_yy0, _uu, _v113);

            int16x8_t _r1 = vmlal_s8(_yy1, _vv, _v90);
            int16x8_t _g1 = vmlsl_s8(_yy1, _vv, _v46);
            _g1 = vmlsl_s8(_g1, _uu, _v22);
            int16x8_t _b1 = vmlal_s8(_yy1, _uu, _v113);

            uint8x8x3_t _rgb0;
            _rgb0.val[0] = vqshrun_n_s16(_r0, 6);
            _rgb0.val[1] = vqshrun_n_s16(_g0, 6);
            _rgb0.val[2] = vqshrun_n_s16(_b0, 6);

            uint8x8x3_t _rgb1;
            _rgb1.val[0] = vqshrun_n_s16(_r1, 6);
            _rgb1.val[1] = vqshrun_n_s16(_g1, 6);
            _rgb1.val[2] = vqshrun_n_s16(_b1, 6);

            vst3_u8(rgb0, _rgb0);
            vst3_u8(rgb1, _rgb1);

            yptr0 += 8;
            yptr1 += 8;
            vuptr += 8;
            rgb0 += 24;
            rgb1 += 24;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "pld        [%3, #128]          \n"
            "vld1.u8    {d2}, [%3]!         \n"
            "vsub.s8    d2, d2, %12         \n"
            "0:                             \n"
            "pld        [%1, #128]          \n"
            "vld1.u8    {d0}, [%1]!         \n"
            "pld        [%2, #128]          \n"
            "vld1.u8    {d1}, [%2]!         \n"
            "vshll.u8   q2, d0, #6          \n"
            "vorr       d3, d2, d2          \n"
            "vshll.u8   q3, d1, #6          \n"
            "vorr       q9, q2, q2          \n"
            "vtrn.s8    d2, d3              \n"
            "vorr       q11, q3, q3         \n"
            "vmlsl.s8   q9, d2, %14         \n"
            "vorr       q8, q2, q2          \n"
            "vmlsl.s8   q11, d2, %14        \n"
            "vorr       q10, q3, q3         \n"
            "vmlal.s8   q8, d2, %13         \n"
            "vmlal.s8   q2, d3, %16         \n"
            "vmlal.s8   q10, d2, %13        \n"
            "vmlsl.s8   q9, d3, %15         \n"
            "vmlal.s8   q3, d3, %16         \n"
            "vmlsl.s8   q11, d3, %15        \n"
            "vqshrun.s16 d24, q8, #6        \n"
            "vqshrun.s16 d26, q2, #6        \n"
            "vqshrun.s16 d4, q10, #6        \n"
            "vqshrun.s16 d25, q9, #6        \n"
            "vqshrun.s16 d6, q3, #6         \n"
            "vqshrun.s16 d5, q11, #6        \n"
            "pld        [%3, #128]          \n"
            "vld1.u8    {d2}, [%3]!         \n"
            "subs       %0, #1              \n"
            "vst3.u8    {d24-d26}, [%4]!    \n"
            "vsub.s8    d2, d2, %12         \n"
            "vst3.u8    {d4-d6}, [%5]!      \n"
            "bne        0b                  \n"
            "sub        %3, #8              \n"
            : "=r"(nn),     // %0
              "=r"(yptr0),  // %1
              "=r"(yptr1),  // %2
              "=r"(vuptr),  // %3
              "=r"(rgb0),   // %4
              "=r"(rgb1)    // %5
            : "0"(nn),
              "1"(yptr0),
              "2"(yptr1),
              "3"(vuptr),
              "4"(rgb0),
              "5"(rgb1),
              "w"(_v128),   // %12
              "w"(_v90),    // %13
              "w"(_v46),    // %14
              "w"(_v22),    // %15
              "w"(_v113)    // %16
            : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12", "d26"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON

#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);
        for (; remain>0; remain-=2)
        {
            // R = 1.164 * yy + 1.596 * vv
            // G = 1.164 * yy - 0.813 * vv - 0.391 * uu
            // B = 1.164 * yy              + 2.018 * uu

            // R = Y + (1.370705 * (V-128))
            // G = Y - (0.698001 * (V-128)) - (0.337633 * (U-128))
            // B = Y + (1.732446 * (U-128))

            // R = ((Y << 6) + 87.72512 * (V-128)) >> 6
            // G = ((Y << 6) - 44.672064 * (V-128) - 21.608512 * (U-128)) >> 6
            // B = ((Y << 6) + 110.876544 * (U-128)) >> 6

            // R = ((Y << 6) + 90 * (V-128)) >> 6
            // G = ((Y << 6) - 46 * (V-128) - 22 * (U-128)) >> 6
            // B = ((Y << 6) + 113 * (U-128)) >> 6

            // R = (yy + 90 * vv) >> 6
            // G = (yy - 46 * vv - 22 * uu) >> 6
            // B = (yy + 113 * uu) >> 6

            int v = vuptr[0] - 128;
            int u = vuptr[1] - 128;

            int ruv = 90 * v;
            int guv = -46 * v + -22 * u;
            int buv = 113 * u;

            int y00 = yptr0[0] << 6;
            rgb0[0] = SATURATE_CAST_UCHAR((y00 + ruv) >> 6);
            rgb0[1] = SATURATE_CAST_UCHAR((y00 + guv) >> 6);
            rgb0[2] = SATURATE_CAST_UCHAR((y00 + buv) >> 6);

            int y01 = yptr0[1] << 6;
            rgb0[3] = SATURATE_CAST_UCHAR((y01 + ruv) >> 6);
            rgb0[4] = SATURATE_CAST_UCHAR((y01 + guv) >> 6);
            rgb0[5] = SATURATE_CAST_UCHAR((y01 + buv) >> 6);

            int y10 = yptr1[0] << 6;
            rgb1[0] = SATURATE_CAST_UCHAR((y10 + ruv) >> 6);
            rgb1[1] = SATURATE_CAST_UCHAR((y10 + guv) >> 6);
            rgb1[2] = SATURATE_CAST_UCHAR((y10 + buv) >> 6);

            int y11 = yptr1[1] << 6;
            rgb1[3] = SATURATE_CAST_UCHAR((y11 + ruv) >> 6);
            rgb1[4] = SATURATE_CAST_UCHAR((y11 + guv) >> 6);
            rgb1[5] = SATURATE_CAST_UCHAR((y11 + buv) >> 6);

            yptr0 += 2;
            yptr1 += 2;
            vuptr += 2;
            rgb0 += 6;
            rgb1 += 6;
        }
#undef SATURATE_CAST_UCHAR

        yptr += 2*w;
        rgb += 2*3*w;
    }
}